

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O1

void irr::executeBlit_TextureBlendColor_16_to_16(SBlitJob *job)

{
  ushort uVar1;
  uint uVar2;
  u32 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  u32 uVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  
  uVar2 = job->argb;
  uVar3 = job->height;
  fVar13 = floorf((float)job->x_stretch * 262144.0 + 0.0);
  fVar14 = floorf((float)job->y_stretch * 262144.0 + 0.0);
  if (uVar3 != 0) {
    pvVar7 = job->src;
    pvVar8 = job->dst;
    iVar4 = job->srcPitch;
    uVar5 = job->width;
    uVar6 = job->dstPitch;
    iVar12 = 0;
    uVar10 = 0;
    do {
      if ((ulong)uVar5 != 0) {
        uVar9 = 0;
        iVar11 = 0;
        do {
          uVar1 = *(ushort *)
                   ((long)pvVar7 + (long)(iVar11 >> 0x12) * 2 + (long)(iVar12 >> 0x12) * (long)iVar4
                   );
          if ((short)uVar1 < 0) {
            *(ushort *)((long)pvVar8 + uVar9 * 2) =
                 (ushort)((uVar1 & 0x1f) * (uVar2 >> 3 & 0x1f) >> 5) |
                 (ushort)(uVar2 >> 0x10) & 0x8000 |
                 (ushort)((uVar1 & 0x3e0) * (uVar2 >> 6 & 0x3e0) >> 10) & 0xffe0 |
                 (ushort)((uVar1 & 0x7c00) * (uVar2 >> 9 & 0x7c00) >> 0xf) & 0x7c00;
          }
          uVar9 = uVar9 + 1;
          iVar11 = iVar11 + (int)fVar13;
        } while (uVar5 != uVar9);
      }
      pvVar8 = (void *)((long)pvVar8 + (ulong)uVar6);
      uVar10 = uVar10 + 1;
      iVar12 = iVar12 + (int)fVar14;
    } while (uVar10 != uVar3);
  }
  return;
}

Assistant:

static void executeBlit_TextureBlendColor_16_to_16(const SBlitJob *job)
{
	const u16 blend = video::A8R8G8B8toA1R5G5B5(job->argb);

	const f18 wscale = f32_to_f18(job->x_stretch);
	const f18 hscale = f32_to_f18(job->y_stretch);

	f18 src_y = f18_zero;
	u16 *dst = (u16 *)job->dst;
	for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
		const u16 *src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));
		f18 src_x = f18_zero;
		for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
			u16 c0 = src[f18_floor(src_x)];
			if (0 == (c0 & 0x8000))
				continue;

			dst[dx] = PixelMul16_2(c0, blend);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}